

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  char *pcVar4;
  unsigned_long local_28;
  unsigned_long ul;
  int i;
  int opt;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  progname = *argv;
  _i = argv;
  argv_local._0_4_ = argc;
  for (ul._0_4_ = str_len(progname); (uint)ul != 0; ul._0_4_ = (uint)ul - 1) {
    if (progname[(int)((uint)ul - 1)] == '/') {
      progname = progname + (int)(uint)ul;
      break;
    }
  }
  if (*progname == 'd') {
    progname = progname + 1;
  }
  iVar1 = str_diff(progname,"setuidgid");
  if (iVar1 == 0) {
    setuidgid((int)argv_local,_i);
  }
  iVar1 = str_diff(progname,"envuidgid");
  if (iVar1 == 0) {
    envuidgid((int)argv_local,_i);
  }
  iVar1 = str_diff(progname,"envdir");
  if (iVar1 == 0) {
    envdir((int)argv_local,_i);
  }
  iVar1 = str_diff(progname,"pgrphack");
  if (iVar1 == 0) {
    pgrphack((int)argv_local,_i);
  }
  iVar1 = str_diff(progname,"setlock");
  if (iVar1 == 0) {
    setlock((int)argv_local,_i);
  }
  iVar1 = str_diff(progname,"softlimit");
  if (iVar1 == 0) {
    softlimit((int)argv_local,_i);
  }
  do {
    ul._4_4_ = sgetoptmine((int)argv_local,_i,"u:U:b:e:m:d:o:p:f:c:r:t:/:n:l:L:vP012V");
    pcVar4 = subgetoptarg;
    if (ul._4_4_ == subgetoptdone) {
      _i = _i + subgetoptind;
      if ((_i == (char **)0x0) || (*_i == (char *)0x0)) {
        usage();
      }
      if (pgrp != 0) {
        setsid();
      }
      if (env_dir != (char *)0x0) {
        edir(env_dir);
      }
      if (root != (char *)0x0) {
        iVar1 = chdir(root);
        if (iVar1 == -1) {
          fatal2("unable to change directory",root);
        }
        iVar1 = chroot(".");
        if (iVar1 == -1) {
          fatal("unable to change root directory");
        }
      }
      if (nicelvl != 0) {
        piVar3 = __errno_location();
        *piVar3 = 0;
        iVar1 = nice((int)nicelvl);
        if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 != 0)) {
          fatal("unable to set nice level");
        }
      }
      if (env_user != (char *)0x0) {
        euidgid(env_user,1);
      }
      if (set_user != (char *)0x0) {
        suidgid(set_user,1);
      }
      if (lock != (char *)0x0) {
        slock(lock,lockdelay,0);
      }
      if ((nostdin != 0) && (iVar1 = close(0), iVar1 == -1)) {
        fatal("unable to close stdin");
      }
      if ((nostdout != 0) && (iVar1 = close(1), iVar1 == -1)) {
        fatal("unable to close stdout");
      }
      if ((nostderr != 0) && (iVar1 = close(2), iVar1 == -1)) {
        fatal("unable to close stderr");
      }
      slimit();
      progname = *_i;
      if (argv0 != (char *)0x0) {
        *_i = argv0;
      }
      pathexec_env_run(progname,_i);
      fatal2("unable to run",*_i);
      return 0;
    }
    switch(ul._4_4_) {
    case 0x2f:
      root = subgetoptarg;
      break;
    case 0x30:
      nostdin = 1;
      break;
    case 0x31:
      nostdout = 1;
      break;
    case 0x32:
      nostderr = 1;
      break;
    case 0x4c:
      if (lock != (char *)0x0) {
        usage();
      }
      lock = subgetoptarg;
      lockdelay = 0;
      break;
    case 0x50:
      pgrp = 1;
      break;
    case 0x55:
      env_user = subgetoptarg;
      break;
    case 0x56:
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
    case 0x3f:
      usage();
      break;
    case 0x62:
      argv0 = subgetoptarg;
      break;
    case 99:
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      limitc = local_28;
      break;
    case 100:
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      limitd = local_28;
      break;
    case 0x65:
      env_dir = subgetoptarg;
      break;
    case 0x66:
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      limitf = local_28;
      break;
    case 0x6c:
      if (lock != (char *)0x0) {
        usage();
      }
      lock = subgetoptarg;
      lockdelay = 1;
      break;
    case 0x6d:
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      limitd = local_28;
      limita = local_28;
      limitl = local_28;
      limits = local_28;
      break;
    case 0x6e:
      if (*subgetoptarg == '+') {
        subgetoptarg = subgetoptarg + 1;
      }
      else if (*subgetoptarg == '-') {
        pcVar4 = subgetoptarg + 1;
        subgetoptarg = pcVar4;
        uVar2 = scan_ulong(pcVar4,&local_28);
        if (pcVar4[uVar2] != '\0') {
          usage();
        }
        nicelvl = -local_28;
        break;
      }
      pcVar4 = subgetoptarg;
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      nicelvl = local_28;
      break;
    case 0x6f:
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      limito = local_28;
      break;
    case 0x70:
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      limitp = local_28;
      break;
    case 0x72:
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      limitr = local_28;
      break;
    case 0x74:
      uVar2 = scan_ulong(subgetoptarg,&local_28);
      if (pcVar4[uVar2] != '\0') {
        usage();
      }
      limitt = local_28;
      break;
    case 0x75:
      set_user = subgetoptarg;
      break;
    case 0x76:
      verbose = 1;
    }
  } while( true );
}

Assistant:

int main(int argc, const char **argv) {
  int opt;
  int i;
  unsigned long ul;

  progname =argv[0];
  for (i =str_len(progname); i; --i)
    if (progname[i -1] == '/') {
      progname +=i;
      break;
    }
  if (progname[0] == 'd') ++progname;

  /* argv[0] */
  if (str_equal(progname, "setuidgid")) setuidgid(argc, argv);
  if (str_equal(progname, "envuidgid")) envuidgid(argc, argv);
  if (str_equal(progname, "envdir")) envdir(argc, argv);
  if (str_equal(progname, "pgrphack")) pgrphack(argc, argv);
  if (str_equal(progname, "setlock")) setlock(argc, argv);
  if (str_equal(progname, "softlimit")) softlimit(argc, argv);

  while ((opt =getopt(argc, argv, "u:U:b:e:m:d:o:p:f:c:r:t:/:n:l:L:vP012V"))
         != opteof)
    switch(opt) {
    case 'u': set_user =(char*)optarg; break;
    case 'U': env_user =(char*)optarg; break;
    case 'b': argv0 =(char*)optarg; break;
    case 'e': env_dir =optarg; break;
    case 'm':
      if (optarg[scan_ulong(optarg, &ul)]) usage();
      limits =limitl =limita =limitd =ul;
      break;
    case 'd': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitd =ul; break;
    case 'o': if (optarg[scan_ulong(optarg, &ul)]) usage(); limito =ul; break;
    case 'p': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitp =ul; break;
    case 'f': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitf =ul; break;
    case 'c': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitc =ul; break;
    case 'r': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitr =ul; break;
    case 't': if (optarg[scan_ulong(optarg, &ul)]) usage(); limitt =ul; break;
    case '/': root =optarg; break;
    case 'n':
      switch (*optarg) {
        case '-':
          ++optarg; /* about ordering safety.... */
          if (optarg[scan_ulong(optarg, &ul)]) usage(); nicelvl =ul;
          nicelvl *=-1;
          break;
        case '+': ++optarg;
        default:
          if (optarg[scan_ulong(optarg, &ul)]) usage(); nicelvl =ul;
          break;
      }
      break;
    case 'l': if (lock) usage(); lock =optarg; lockdelay =1; break;
    case 'L': if (lock) usage(); lock =optarg; lockdelay =0; break;
    case 'v': verbose =1; break;
    case 'P': pgrp =1; break;
    case '0': nostdin =1; break;
    case '1': nostdout =1; break;
    case '2': nostderr =1; break;
    case 'V': strerr_warn1(VERSION, 0);
    case '?': usage();
    }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if (pgrp) setsid();
  if (env_dir) edir(env_dir);
  if (root) {
    if (chdir(root) == -1) fatal2("unable to change directory", root);
    if (chroot(".") == -1) fatal("unable to change root directory");
  }
  if (nicelvl) {
    errno =0;
    if (nice(nicelvl) == -1) if (errno) fatal("unable to set nice level");
  }
  if (env_user) euidgid(env_user, 1);
  if (set_user) suidgid(set_user, 1);
  if (lock) slock(lock, lockdelay, 0);
  if (nostdin) if (close(0) == -1) fatal("unable to close stdin");
  if (nostdout) if (close(1) == -1) fatal("unable to close stdout");
  if (nostderr) if (close(2) == -1) fatal("unable to close stderr");
  slimit();

  progname =*argv;
  if (argv0) *argv =argv0;
  pathexec_env_run(progname, argv);
  fatal2("unable to run", *argv);
  return(0);
}